

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseImporter.cpp
# Opt level: O0

bool Assimp::BaseImporter::CheckMagicToken
               (IOSystem *pIOHandler,string *pFile,void *_magic,uint num,uint offset,uint size)

{
  int iVar1;
  IOStream *__p;
  pointer pIVar2;
  undefined4 extraout_var;
  uint local_9c;
  ushort local_96;
  uint32_t rev_1;
  undefined4 uStack_90;
  uint16_t rev;
  uint i;
  char data [16];
  allocator local_69;
  string local_68;
  unique_ptr<Assimp::IOStream,_std::default_delete<Assimp::IOStream>_> local_48;
  unique_ptr<Assimp::IOStream,_std::default_delete<Assimp::IOStream>_> pStream;
  char *magic;
  uint size_local;
  uint offset_local;
  uint num_local;
  void *_magic_local;
  string *pFile_local;
  IOSystem *pIOHandler_local;
  
  if (0x10 < size) {
    __assert_fail("size <= 16",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/royalneverwin[P]Computer_graphics/third_party/assimp/code/Common/BaseImporter.cpp"
                  ,0x11e,
                  "static bool Assimp::BaseImporter::CheckMagicToken(IOSystem *, const std::string &, const void *, unsigned int, unsigned int, unsigned int)"
                 );
  }
  if (_magic == (void *)0x0) {
    __assert_fail("_magic",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/royalneverwin[P]Computer_graphics/third_party/assimp/code/Common/BaseImporter.cpp"
                  ,0x11f,
                  "static bool Assimp::BaseImporter::CheckMagicToken(IOSystem *, const std::string &, const void *, unsigned int, unsigned int, unsigned int)"
                 );
  }
  if (pIOHandler == (IOSystem *)0x0) {
    return false;
  }
  pStream._M_t.super___uniq_ptr_impl<Assimp::IOStream,_std::default_delete<Assimp::IOStream>_>._M_t.
  super__Tuple_impl<0UL,_Assimp::IOStream_*,_std::default_delete<Assimp::IOStream>_>.
  super__Head_base<0UL,_Assimp::IOStream_*,_false>._M_head_impl =
       (__uniq_ptr_data<Assimp::IOStream,_std::default_delete<Assimp::IOStream>,_true,_true>)
       (__uniq_ptr_data<Assimp::IOStream,_std::default_delete<Assimp::IOStream>,_true,_true>)_magic;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_68,"rb",&local_69);
  __p = IOSystem::Open(pIOHandler,pFile,&local_68);
  std::unique_ptr<Assimp::IOStream,std::default_delete<Assimp::IOStream>>::
  unique_ptr<std::default_delete<Assimp::IOStream>,void>
            ((unique_ptr<Assimp::IOStream,std::default_delete<Assimp::IOStream>> *)&local_48,__p);
  std::__cxx11::string::~string((string *)&local_68);
  std::allocator<char>::~allocator((allocator<char> *)&local_69);
  pIVar2 = std::unique_ptr<Assimp::IOStream,_std::default_delete<Assimp::IOStream>_>::get(&local_48)
  ;
  if (pIVar2 != (pointer)0x0) {
    pIVar2 = std::unique_ptr<Assimp::IOStream,_std::default_delete<Assimp::IOStream>_>::operator->
                       (&local_48);
    (*pIVar2->_vptr_IOStream[4])(pIVar2,(ulong)offset,0);
    pIVar2 = std::unique_ptr<Assimp::IOStream,_std::default_delete<Assimp::IOStream>_>::operator->
                       (&local_48);
    iVar1 = (*pIVar2->_vptr_IOStream[2])(pIVar2,&i,1,(ulong)size);
    if ((ulong)size != CONCAT44(extraout_var,iVar1)) {
      pIOHandler_local._7_1_ = false;
      goto LAB_001685b4;
    }
    for (rev_1 = 0; rev_1 < num; rev_1 = rev_1 + 1) {
      if (size == 2) {
        local_96 = *(ushort *)
                    pStream._M_t.
                    super___uniq_ptr_impl<Assimp::IOStream,_std::default_delete<Assimp::IOStream>_>.
                    _M_t.
                    super__Tuple_impl<0UL,_Assimp::IOStream_*,_std::default_delete<Assimp::IOStream>_>
                    .super__Head_base<0UL,_Assimp::IOStream_*,_false>._M_head_impl;
        ByteSwap::Swap(&local_96);
        if (((i & 0xffff) ==
             (uint)*(ushort *)
                    pStream._M_t.
                    super___uniq_ptr_impl<Assimp::IOStream,_std::default_delete<Assimp::IOStream>_>.
                    _M_t.
                    super__Tuple_impl<0UL,_Assimp::IOStream_*,_std::default_delete<Assimp::IOStream>_>
                    .super__Head_base<0UL,_Assimp::IOStream_*,_false>._M_head_impl) ||
           ((i & 0xffff) == (uint)local_96)) {
          pIOHandler_local._7_1_ = true;
          goto LAB_001685b4;
        }
      }
      else if (size == 4) {
        local_9c = *(uint *)pStream._M_t.
                            super___uniq_ptr_impl<Assimp::IOStream,_std::default_delete<Assimp::IOStream>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_Assimp::IOStream_*,_std::default_delete<Assimp::IOStream>_>
                            .super__Head_base<0UL,_Assimp::IOStream_*,_false>._M_head_impl;
        ByteSwap::Swap(&local_9c);
        if ((i == *(uint *)pStream._M_t.
                           super___uniq_ptr_impl<Assimp::IOStream,_std::default_delete<Assimp::IOStream>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_Assimp::IOStream_*,_std::default_delete<Assimp::IOStream>_>
                           .super__Head_base<0UL,_Assimp::IOStream_*,_false>._M_head_impl) ||
           (i == local_9c)) {
          pIOHandler_local._7_1_ = true;
          goto LAB_001685b4;
        }
      }
      else {
        iVar1 = memcmp((void *)pStream._M_t.
                               super___uniq_ptr_impl<Assimp::IOStream,_std::default_delete<Assimp::IOStream>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_Assimp::IOStream_*,_std::default_delete<Assimp::IOStream>_>
                               .super__Head_base<0UL,_Assimp::IOStream_*,_false>._M_head_impl,&i,
                       (ulong)size);
        if (iVar1 == 0) {
          pIOHandler_local._7_1_ = true;
          goto LAB_001685b4;
        }
      }
      pStream._M_t.super___uniq_ptr_impl<Assimp::IOStream,_std::default_delete<Assimp::IOStream>_>.
      _M_t.super__Tuple_impl<0UL,_Assimp::IOStream_*,_std::default_delete<Assimp::IOStream>_>.
      super__Head_base<0UL,_Assimp::IOStream_*,_false>._M_head_impl =
           (__uniq_ptr_data<Assimp::IOStream,_std::default_delete<Assimp::IOStream>,_true,_true>)
           ((long)pStream._M_t.
                  super___uniq_ptr_impl<Assimp::IOStream,_std::default_delete<Assimp::IOStream>_>.
                  _M_t.
                  super__Tuple_impl<0UL,_Assimp::IOStream_*,_std::default_delete<Assimp::IOStream>_>
                  .super__Head_base<0UL,_Assimp::IOStream_*,_false>._M_head_impl + (ulong)size);
    }
  }
  pIOHandler_local._7_1_ = false;
LAB_001685b4:
  uStack_90 = 1;
  std::unique_ptr<Assimp::IOStream,_std::default_delete<Assimp::IOStream>_>::~unique_ptr(&local_48);
  return pIOHandler_local._7_1_;
}

Assistant:

bool BaseImporter::CheckMagicToken(IOSystem* pIOHandler, const std::string& pFile,
    const void* _magic, unsigned int num, unsigned int offset, unsigned int size)
{
    ai_assert( size <= 16 );
    ai_assert( _magic );

    if (!pIOHandler) {
        return false;
    }
    union {
        const char* magic;
        const uint16_t* magic_u16;
        const uint32_t* magic_u32;
    };
    magic = reinterpret_cast<const char*>(_magic);
    std::unique_ptr<IOStream> pStream (pIOHandler->Open(pFile));
    if (pStream.get() ) {

        // skip to offset
        pStream->Seek(offset,aiOrigin_SET);

        // read 'size' characters from the file
        union {
            char data[16];
            uint16_t data_u16[8];
            uint32_t data_u32[4];
        };
        if(size != pStream->Read(data,1,size)) {
            return false;
        }

        for (unsigned int i = 0; i < num; ++i) {
            // also check against big endian versions of tokens with size 2,4
            // that's just for convenience, the chance that we cause conflicts
            // is quite low and it can save some lines and prevent nasty bugs
            if (2 == size) {
                uint16_t rev = *magic_u16;
                ByteSwap::Swap(&rev);
                if (data_u16[0] == *magic_u16 || data_u16[0] == rev) {
                    return true;
                }
            }
            else if (4 == size) {
                uint32_t rev = *magic_u32;
                ByteSwap::Swap(&rev);
                if (data_u32[0] == *magic_u32 || data_u32[0] == rev) {
                    return true;
                }
            }
            else {
                // any length ... just compare
                if(!memcmp(magic,data,size)) {
                    return true;
                }
            }
            magic += size;
        }
    }
    return false;
}